

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O1

int SSL_set1_sigalgs(SSL *ssl,int *values,size_t num_values)

{
  SSL_CONFIG *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Array<unsigned_short> sigalgs;
  Array<unsigned_short> local_28;
  
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl == (SSL_CONFIG *)0x0) {
    iVar4 = 0;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x2af);
  }
  else {
    local_28.data_ = (uint16_t *)0x0;
    local_28.size_ = 0;
    bVar2 = parse_sigalg_pairs(&local_28,values,num_values);
    iVar4 = 0;
    if (bVar2) {
      pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
      iVar4 = 0;
      iVar3 = 0;
      if (pSVar1 != (SSL_CONFIG *)0x0) {
        iVar3 = SSL_CREDENTIAL_set1_signing_algorithm_prefs
                          (*(SSL_CREDENTIAL **)
                            ((long)(pSVar1->cert)._M_t.
                                   super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter> + 0x18
                            ),local_28.data_,local_28.size_);
      }
      if (iVar3 != 0) {
        iVar4 = SSL_set_verify_algorithm_prefs(ssl,local_28.data_,local_28.size_);
      }
    }
    OPENSSL_free(local_28.data_);
  }
  return iVar4;
}

Assistant:

int SSL_set1_sigalgs(SSL *ssl, const int *values, size_t num_values) {
  if (!ssl->config) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  Array<uint16_t> sigalgs;
  if (!parse_sigalg_pairs(&sigalgs, values, num_values)) {
    return 0;
  }

  if (!SSL_set_signing_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size()) ||
      !SSL_set_verify_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size())) {
    return 0;
  }

  return 1;
}